

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.cc
# Opt level: O3

void __thiscall
GOESRImageHandler::handleImageForFalseColor(GOESRImageHandler *this,GOESRProduct *p1)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>_>
  *this_00;
  pointer pcVar1;
  pointer pbVar2;
  undefined8 uVar3;
  int iVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  long lVar7;
  long *plVar8;
  runtime_error *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  int *in_R9;
  unique_ptr<Image,_std::default_delete<Image>_> i1;
  unique_ptr<Image,_std::default_delete<Image>_> i0;
  unique_ptr<Image,_std::default_delete<Image>_> out;
  string path;
  string key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  Timer t;
  Mat mat;
  type p0;
  FilenameBuilder fb;
  undefined1 local_580 [16];
  undefined1 local_570 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528;
  Timer local_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8 [5];
  undefined1 local_468 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  _Alloc_hider _Stack_448;
  undefined1 local_440 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  _Alloc_hider local_400;
  pointer local_3f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  _Alloc_hider local_3e0;
  pointer local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  _Alloc_hider local_3c0;
  pointer local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  _Alloc_hider local_3a0;
  pointer local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  _Alloc_hider local_380;
  _Base_ptr local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  int local_360;
  _Alloc_hider local_358;
  size_type local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  _Alloc_hider local_338;
  size_type local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  _Alloc_hider local_318;
  size_type local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  bool local_2f8;
  undefined1 local_2e8 [32];
  _Alloc_hider _Stack_2c8;
  _Alloc_hider local_2c0;
  undefined1 local_2b8 [24];
  _Alloc_hider local_2a0;
  _Alloc_hider local_298;
  undefined1 local_290 [24];
  _Alloc_hider local_278;
  undefined1 local_270 [24];
  _Alloc_hider local_258;
  undefined1 local_250 [24];
  _Alloc_hider local_238;
  undefined1 local_230 [24];
  _Alloc_hider local_218;
  undefined1 local_210 [24];
  _Alloc_hider local_1f8;
  undefined1 local_1f0 [24];
  _Alloc_hider local_1d8;
  size_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Alloc_hider local_1b8;
  size_type local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  bool local_178;
  undefined1 local_d8 [8];
  char *local_d0;
  undefined1 local_b8 [8];
  char *local_b0;
  Mat local_90 [96];
  
  Timer::Timer(&local_510);
  local_548._M_allocated_capacity = (size_type)&local_538;
  pcVar1 = (p1->region_).nameShort._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_548,pcVar1,pcVar1 + (p1->region_).nameShort._M_string_length);
  this_00 = &this->falseColor_;
  iVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,(key_type *)&local_548);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>,_true>
      ._M_cur == (__node_type *)0x0) {
    pmVar6 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,(key_type *)&local_548);
    GOESRProduct::operator=(pmVar6,p1);
    goto LAB_0017ff16;
  }
  pmVar6 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,(key_type *)&local_548);
  GOESRProduct::GOESRProduct((GOESRProduct *)local_468,pmVar6);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_erase(&this_00->_M_h,&local_548);
  pcVar1 = local_3b8;
  if (local_458._8_8_ == (p1->frameStart_).tv_sec) {
    if (local_3b8 == (pointer)(p1->channel_).nameShort._M_string_length) {
      if (local_3b8 != (pointer)0x0) {
        iVar4 = bcmp(local_3c0._M_p,(p1->channel_).nameShort._M_dataplus._M_p,(size_t)local_3b8);
        if (iVar4 != 0) goto LAB_0017f653;
      }
      pmVar6 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00,(key_type *)&local_548);
      p1 = (GOESRProduct *)local_468;
      goto LAB_0017f734;
    }
LAB_0017f653:
    pbVar2 = (this->config_).channels.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pcVar1 == (pointer)pbVar2->_M_string_length) {
      if (pcVar1 != (pointer)0x0) {
        iVar4 = bcmp(local_3c0._M_p,(pbVar2->_M_dataplus)._M_p,(size_t)pcVar1);
        if (iVar4 != 0) goto LAB_0017f685;
      }
    }
    else {
LAB_0017f685:
      local_2c0._M_p = local_2b8 + 8;
      local_2e8._0_8_ = local_468._0_8_;
      local_2e8._8_8_ = local_468._8_8_;
      local_2e8._16_8_ = local_458._M_allocated_capacity;
      local_468._0_8_ = (pointer)0x0;
      local_468._8_8_ = (pointer)0x0;
      local_458._M_allocated_capacity = 0;
      local_2e8._24_8_ = local_458._8_8_;
      _Stack_2c8._M_p = _Stack_448._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._0_8_ == &local_430) {
        local_2b8._16_8_ = local_430._8_8_;
      }
      else {
        local_2c0._M_p = (pointer)local_440._0_8_;
      }
      local_2a0._M_p = local_290;
      local_2b8._0_8_ = local_440._8_8_;
      local_440._8_8_ = 0;
      local_430._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420._M_allocated_capacity == &local_410) {
        local_290._8_8_ = local_410._8_8_;
      }
      else {
        local_2a0._M_p = (pointer)local_420._M_allocated_capacity;
      }
      local_290._16_8_ = local_270;
      local_298._M_p = (pointer)local_420._8_8_;
      local_420._8_8_ = 0;
      local_410._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_400._M_p == &local_3f0) {
        local_270._8_8_ = local_3f0._8_8_;
      }
      else {
        local_290._16_8_ = local_400._M_p;
      }
      local_278._M_p = (pointer)local_3f8;
      local_3f8 = (pointer)0x0;
      local_3f0._M_local_buf[0] = '\0';
      local_270._16_8_ = local_250;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0._M_p == &local_3d0) {
        local_250._8_8_ = local_3d0._8_8_;
      }
      else {
        local_270._16_8_ = local_3e0._M_p;
      }
      local_258._M_p = local_3d8;
      local_3d8 = (pointer)0x0;
      local_3d0._M_local_buf[0] = '\0';
      local_250._16_8_ = local_230;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_p == &local_3b0) {
        local_230._8_8_ = local_3b0._8_8_;
      }
      else {
        local_250._16_8_ = local_3c0._M_p;
      }
      local_238._M_p = pcVar1;
      local_3b8 = (pointer)0x0;
      local_3b0._M_local_buf[0] = '\0';
      local_230._16_8_ = local_210;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0._M_p == &local_390) {
        local_210._8_8_ = local_390._8_8_;
      }
      else {
        local_230._16_8_ = local_3a0._M_p;
      }
      local_218._M_p = local_398;
      local_398 = (pointer)0x0;
      local_390._M_local_buf[0] = '\0';
      local_210._16_8_ = local_1f0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_p == &local_370) {
        local_1f0._8_8_ = local_370._8_8_;
      }
      else {
        local_210._16_8_ = local_380._M_p;
      }
      local_1f8._M_p = (pointer)local_378;
      local_378 = (_Base_ptr)0x0;
      local_370._M_local_buf[0] = '\0';
      local_1f0._16_4_ = local_360;
      local_1d8._M_p = (pointer)&local_1c8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_p == &local_348) {
        local_1c8._8_8_ = local_348._8_8_;
      }
      else {
        local_1d8._M_p = local_358._M_p;
      }
      local_1d0 = local_350;
      local_350 = 0;
      local_348._M_local_buf[0] = '\0';
      local_1b8._M_p = (pointer)&local_1a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_p == &local_328) {
        local_1a8._8_8_ = local_328._8_8_;
      }
      else {
        local_1b8._M_p = local_338._M_p;
      }
      local_1b0 = local_330;
      local_330 = 0;
      local_328._M_local_buf[0] = '\0';
      local_198._M_p = (pointer)&local_188;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_p == &local_308) {
        local_188._8_8_ = local_308._8_8_;
      }
      else {
        local_198._M_p = local_318._M_p;
      }
      local_190 = local_310;
      local_310 = 0;
      local_308._M_local_buf[0] = '\0';
      local_178 = local_2f8;
      local_440._0_8_ = &local_430;
      local_420._M_allocated_capacity = (size_type)&local_410;
      local_400._M_p = (pointer)&local_3f0;
      local_3e0._M_p = (pointer)&local_3d0;
      local_3c0._M_p = (pointer)&local_3b0;
      local_3a0._M_p = (pointer)&local_390;
      local_380._M_p = (pointer)&local_370;
      local_358._M_p = (pointer)&local_348;
      local_338._M_p = (pointer)&local_328;
      local_318._M_p = (pointer)&local_308;
      GOESRProduct::operator=((GOESRProduct *)local_468,p1);
      GOESRProduct::operator=(p1,(GOESRProduct *)local_2e8);
      GOESRProduct::~GOESRProduct((GOESRProduct *)local_2e8);
    }
    GOESRProduct::getFilenameBuilder
              ((FilenameBuilder *)local_2e8,(GOESRProduct *)local_468,&this->config_);
    local_4e8._M_allocated_capacity = (size_type)&local_4d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4e8,_Stack_2c8._M_p,local_2c0._M_p + (long)_Stack_2c8._M_p);
    util::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_528,(string *)&local_4e8,'_');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8._M_allocated_capacity != &local_4d8) {
      operator_delete((void *)local_4e8._M_allocated_capacity,local_4d8._M_allocated_capacity + 1);
    }
    lVar7 = std::__cxx11::string::rfind((char)local_528._M_allocated_capacity + ' ',0x43);
    if (lVar7 == -1) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_570._8_4_ = 0x22e;
      util::str<char[48],char[100],char[2],int>
                ((string *)&local_4c8,(util *)"Assertion `pos != std::string::npos` failed at ",
                 (char (*) [48])
                 "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/goesproc/handler_goesr.cc"
                 ,(char (*) [100])0x1afe61,(char (*) [2])(local_570 + 8),in_R9);
      std::runtime_error::runtime_error(this_01,(string *)local_4c8._M_local_buf);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::substr((ulong)(local_570 + 8),local_528._M_allocated_capacity + 0x20);
    plVar8 = (long *)std::__cxx11::string::append(local_570 + 8);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 == paVar9) {
      local_4b8[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_4b8[0]._8_8_ = plVar8[3];
      local_4c8._M_allocated_capacity = (size_type)local_4b8;
    }
    else {
      local_4b8[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_4c8._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar8;
    }
    local_4c8._8_8_ = plVar8[1];
    *plVar8 = (long)paVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::operator=
              ((string *)(local_528._M_allocated_capacity + 0x20),(string *)local_4c8._M_local_buf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_allocated_capacity != local_4b8) {
      operator_delete((void *)local_4c8._M_allocated_capacity,local_4b8[0]._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_570._12_4_,local_570._8_4_) != &local_558) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_570._12_4_,local_570._8_4_),
                      local_558._M_allocated_capacity + 1);
    }
    util::join((string *)&local_4c8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_528,'_');
    std::__cxx11::string::operator=((string *)&_Stack_2c8,(string *)local_4c8._M_local_buf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_allocated_capacity != local_4b8) {
      operator_delete((void *)local_4c8._M_allocated_capacity,local_4b8[0]._0_8_ + 1);
    }
    std::__cxx11::string::_M_replace((ulong)local_d8,0,local_d0,0x1b1a3f);
    std::__cxx11::string::_M_replace((ulong)local_b8,0,local_b0,0x1b1a42);
    GOESRProduct::getImage((GOESRProduct *)(local_580 + 8),(Handler *)local_468);
    GOESRProduct::getImage((GOESRProduct *)local_580,(Handler *)p1);
    cv::Mat::Mat(local_90,&(this->config_).lut);
    Image::generateFalseColor
              ((Image *)local_570,(unique_ptr<Image,_std::default_delete<Image>_> *)(local_580 + 8),
               (unique_ptr<Image,_std::default_delete<Image>_> *)local_580,local_90);
    cv::Mat::~Mat(local_90);
    uVar3 = local_580._8_8_;
    local_580._8_8_ = (Mat *)0x0;
    if ((Mat *)uVar3 != (Mat *)0x0) {
      cv::Mat::~Mat((Mat *)uVar3);
      operator_delete((void *)uVar3,0x78);
    }
    uVar3 = local_580._0_8_;
    local_580._0_8_ = (__uniq_ptr_impl<Image,_std::default_delete<Image>_>)0x0;
    if ((tuple<Image_*,_std::default_delete<Image>_>)uVar3 != (_Head_base<0UL,_Image_*,_false>)0x0)
    {
      cv::Mat::~Mat((Mat *)uVar3);
      operator_delete((void *)uVar3,0x78);
    }
    Image::getRawImage((Image *)&local_4c8);
    pcVar1 = (this->config_).format._M_dataplus._M_p;
    local_508._M_allocated_capacity = (size_type)&local_4f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_508,pcVar1,pcVar1 + (this->config_).format._M_string_length);
    FilenameBuilder::build
              ((string *)(local_570 + 8),(FilenameBuilder *)local_2e8,&(this->config_).filename,
               (string *)&local_508);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_allocated_capacity != &local_4f8) {
      operator_delete((void *)local_508._M_allocated_capacity,(ulong)(local_4f8._0_8_ + 1));
    }
    FileWriter::write((this->fileWriter_).super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,(int)local_570 + 8,&local_4c8,(size_t)&local_510);
    if ((this->config_).json == true) {
      FileWriter::writeHeader
                ((this->fileWriter_).super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,*(File **)local_468._0_8_,(string *)(local_570 + 8));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_570._12_4_,local_570._8_4_) != &local_558) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_570._12_4_,local_570._8_4_),
                      local_558._M_allocated_capacity + 1);
    }
    cv::Mat::~Mat((Mat *)local_4c8._M_local_buf);
    std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
              ((unique_ptr<Image,_std::default_delete<Image>_> *)local_570);
    std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
              ((unique_ptr<Image,_std::default_delete<Image>_> *)local_580);
    std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
              ((unique_ptr<Image,_std::default_delete<Image>_> *)(local_580 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_528);
    FilenameBuilder::~FilenameBuilder((FilenameBuilder *)local_2e8);
  }
  else {
    pmVar6 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GOESRProduct>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,(key_type *)&local_548);
LAB_0017f734:
    GOESRProduct::operator=(pmVar6,p1);
  }
  GOESRProduct::~GOESRProduct((GOESRProduct *)local_468);
LAB_0017ff16:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_allocated_capacity != &local_538) {
    operator_delete((void *)local_548._M_allocated_capacity,local_538._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GOESRImageHandler::handleImageForFalseColor(GOESRProduct p1) {
  Timer t;

  const auto key = p1.getRegion().nameShort;
  if (falseColor_.find(key) == falseColor_.end()) {
    falseColor_[key] = std::move(p1);
    return;
  }

  // Move existing product into local scope such that the local
  // one is the only remaining reference to this product.
  auto p0 = std::move(falseColor_[key]);
  falseColor_.erase(key);

  // Verify that observation time is identical.
  if (p0.getFrameStart().tv_sec != p1.getFrameStart().tv_sec) {
    falseColor_[key] = std::move(p1);
    return;
  }

  // If the channels are the same, there has been duplication on the
  // packet stream and we can ignore the latest one.
  if (p0.getChannel().nameShort == p1.getChannel().nameShort) {
    falseColor_[key] = std::move(p0);
    return;
  }

  // Swap if ordering of products doesn't match ordering of channels
  if (p0.getChannel().nameShort != config_.channels.front()) {
    std::swap(p0, p1);
  }

  // Use filename builder of first channel
  auto fb = p0.getFilenameBuilder(config_);

  // Update filename in filename builder to reflect that this is a
  // synthesized image. It would be misleading to use the filename of
  // either one of the input files.
  //
  // For example: in OR_ABI-L2-CMIPF-M3C13_G16_[...] the C13 is
  // replaced by CFC.
  //
  auto parts = split(fb.filename, '_');
  auto pos = parts[1].rfind('C');
  ASSERT(pos != std::string::npos);
  parts[1] = parts[1].substr(0, pos) + "CFC";
  fb.filename = join(parts, '_');

  // Replace channel field in filename builder.
  // The incoming filename builder will have the channel set to one of
  // the two channels used for this false color image.
  fb.channel.nameShort = "FC";
  fb.channel.nameLong = "False Color";

  // Generate false color image.
  auto i0 = p0.getImage(config_);
  auto i1 = p1.getImage(config_);
  auto out = Image::generateFalseColor(i0, i1, config_.lut);
  i0.reset();
  i1.reset();

  auto mat = out->getRawImage();
  overlayMaps(p0, mat);
  auto path = fb.build(config_.filename, config_.format);
  fileWriter_->write(path, mat, &t);
  if (config_.json) {
    fileWriter_->writeHeader(p0.firstFile(), path);
  }
}